

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

QString * __thiscall QMdiSubWindowPrivate::originalWindowTitleHelper(QMdiSubWindowPrivate *this)

{
  bool bVar1;
  QWidget *pQVar2;
  QMdiArea *pQVar3;
  const_iterator o;
  QMdiSubWindow **ppQVar4;
  QMdiSubWindowPrivate *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindowPrivate *subWindowD;
  QMdiSubWindow *subWindow;
  QList<QMdiSubWindow_*> *__range2;
  QList<QMdiSubWindow_*> *subWindows;
  QMdiArea *mdiArea;
  QMdiSubWindow *q;
  const_iterator __end2;
  const_iterator __begin2;
  QString *in_stack_ffffffffffffff68;
  QWidget *this_00;
  undefined4 in_stack_ffffffffffffff80;
  WindowOrder in_stack_ffffffffffffff84;
  int iVar5;
  QMdiArea *in_stack_ffffffffffffff88;
  const_iterator local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar2 = &q_func(in_RSI)->super_QWidget;
  pQVar3 = QMdiSubWindow::mdiArea((QMdiSubWindow *)in_stack_ffffffffffffff88);
  if (pQVar3 != (QMdiArea *)0x0) {
    QMdiArea::subWindowList(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
    local_28[0].i = (QMdiSubWindow **)&DAT_aaaaaaaaaaaaaaaa;
    local_28[0] = QList<QMdiSubWindow_*>::begin((QList<QMdiSubWindow_*> *)in_RDI);
    o = QList<QMdiSubWindow_*>::end((QList<QMdiSubWindow_*> *)in_RDI);
    while (bVar1 = QList<QMdiSubWindow_*>::const_iterator::operator!=(local_28,o), bVar1) {
      ppQVar4 = QList<QMdiSubWindow_*>::const_iterator::operator*(local_28);
      if ((&(*ppQVar4)->super_QWidget != pQVar2) &&
         (bVar1 = QWidget::isMaximized(&(*ppQVar4)->super_QWidget), bVar1)) {
        qt_widget_private((QWidget *)0x62a200);
        bVar1 = QString::isNull((QString *)0x62a216);
        if (!bVar1) {
          QString::QString((QString *)in_RDI,in_stack_ffffffffffffff68);
          iVar5 = 1;
          goto LAB_0062a255;
        }
      }
      QList<QMdiSubWindow_*>::const_iterator::operator++(local_28);
    }
    iVar5 = 0;
LAB_0062a255:
    QList<QMdiSubWindow_*>::~QList((QList<QMdiSubWindow_*> *)0x62a25f);
    if (iVar5 != 0) goto LAB_0062a284;
    in_stack_ffffffffffffff84 = CreationOrder;
  }
  QWidget::window((QWidget *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  QWidget::windowTitle(this_00);
LAB_0062a284:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QString *)this_00;
}

Assistant:

QString QMdiSubWindowPrivate::originalWindowTitleHelper() const
{
    Q_Q(const QMdiSubWindow);
    // QTBUG-92240: When DontMaximizeSubWindowOnActivation is set and
    // there is another subwindow maximized, use its original title.
    if (auto *mdiArea = q->mdiArea()) {
        const auto &subWindows = mdiArea->subWindowList();
        for (auto *subWindow : subWindows) {
            if (subWindow != q && subWindow->isMaximized()) {
                auto *subWindowD = static_cast<QMdiSubWindowPrivate *>(qt_widget_private(subWindow));
                if (!subWindowD->originalTitle.isNull())
                    return subWindowD->originalTitle;
            }
        }
    }
    return q->window()->windowTitle();
}